

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser * init_parse_realm(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_realm_name);
  parser_reg(p,"stat sym stat",parse_realm_stat);
  parser_reg(p,"verb str verb",parse_realm_verb);
  parser_reg(p,"spell-noun str spell",parse_realm_spell_noun);
  parser_reg(p,"book-noun str book",parse_realm_book_noun);
  return p;
}

Assistant:

static struct parser *init_parse_realm(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_realm_name);
	parser_reg(p, "stat sym stat", parse_realm_stat);
	parser_reg(p, "verb str verb", parse_realm_verb);
	parser_reg(p, "spell-noun str spell", parse_realm_spell_noun);
	parser_reg(p, "book-noun str book", parse_realm_book_noun);
	return p;
}